

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
tf::SmallVectorImpl<tf::Node*>::append<std::move_iterator<tf::Node**>>
          (SmallVectorImpl<tf::Node_*> *this,move_iterator<tf::Node_**> in_start,
          move_iterator<tf::Node_**> in_end)

{
  Node **ppNVar1;
  SmallVectorTemplateCommon<tf::Node_*,_void> *this_00;
  iterator ppNVar2;
  move_iterator<tf::Node_**> in_RDX;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_RDI;
  size_type NumInputs;
  move_iterator<tf::Node_**> in_stack_ffffffffffffffb8;
  move_iterator<tf::Node_**> E;
  move_iterator<tf::Node_**> in_stack_ffffffffffffffc0;
  
  ppNVar1 = (Node **)std::distance<std::move_iterator<tf::Node**>>
                               (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  E._M_current = ppNVar1;
  this_00 = (SmallVectorTemplateCommon<tf::Node_*,_void> *)
            SmallVectorTemplateCommon<tf::Node_*,_void>::capacity_ptr(in_RDI);
  ppNVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
  if ((Node **)((long)this_00 - (long)ppNVar2 >> 3) < E._M_current) {
    SmallVectorTemplateCommon<tf::Node_*,_void>::size(this_00);
    SmallVectorTemplateBase<tf::Node_*,_true>::grow
              ((SmallVectorTemplateBase<tf::Node_*,_true> *)this_00,(size_t)in_RDI);
  }
  SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
  SmallVectorTemplateBase<tf::Node*,true>::
  uninitialized_copy<std::move_iterator<tf::Node**>,tf::Node**>(in_RDX,E,(Node **)this_00);
  ppNVar2 = SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RDI);
  SmallVectorTemplateCommon<tf::Node_*,_void>::setEnd(in_RDI,ppNVar2 + (long)ppNVar1);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > size_type(this->capacity_ptr()-this->end()))
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->setEnd(this->end() + NumInputs);
  }